

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

bool __thiscall QToolBarPrivate::mousePressEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  char cVar1;
  bool bVar2;
  QStyle *pQVar3;
  ulong uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QStyleOptionToolBar opt;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  QWidget *this_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOptionToolBar *)local_98);
  pQVar3 = QWidget::style(this_00);
  local_a8 = (**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x34,(QStyleOptionToolBar *)local_98);
  uVar5 = SUB84(this_00,0);
  auVar11 = QEventPoint::position();
  auVar10._0_8_ =
       (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_;
  auVar10._8_8_ =
       (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._0_8_;
  auVar10 = minpd(_DAT_0066f5d0,auVar10);
  auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
  auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
  uVar6 = movmskpd(uVar5,auVar11);
  local_b0 = (ulong)(uint)(int)auVar10._8_8_;
  uVar4 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
  if ((uVar6 & 1) == 0) {
    uVar4 = 0x8000000000000000;
  }
  if ((uVar6 & 2) == 0) {
    local_b0 = 0x80000000;
  }
  local_b0 = local_b0 | uVar4;
  cVar1 = QRect::contains((QPoint *)local_a8,SUB81(&local_b0,0));
  if ((cVar1 != '\0') && (*(int *)(event + 0x40) == 1)) {
    bVar2 = QToolBarLayout::movable(this->layout);
    if (bVar2) {
      auVar10 = QEventPoint::position();
      auVar8._0_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._8_8_;
      auVar8._8_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar10._0_8_;
      auVar10 = minpd(_DAT_0066f5d0,auVar8);
      auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar6 = movmskpd(uVar6,auVar9);
      uVar4 = 0x8000000000000000;
      if ((uVar6 & 1) != 0) {
        uVar4 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
      }
      uVar7 = 0x80000000;
      if ((uVar6 & 2) != 0) {
        uVar7 = (ulong)(uint)(int)auVar10._8_8_;
      }
      local_a8._0_8_ = uVar7 | uVar4;
      initDrag(this,(QPoint *)local_a8);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarPrivate::mousePressEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);
    QStyleOptionToolBar opt;
    q->initStyleOption(&opt);
    if (q->style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, q).contains(event->position().toPoint()) == false) {
#ifdef Q_OS_MACOS
        // When using the unified toolbar on OS X, the user can click and
        // drag between toolbar contents to move the window. Make this work by
        // implementing the standard mouse-dragging code and then call
        // window->move() in mouseMoveEvent below.
        if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parent)) {
            if (mainWindow->toolBarArea(q) == Qt::TopToolBarArea
                    && mainWindow->unifiedTitleAndToolBarOnMac()
                    && q->childAt(event->pos()) == 0) {
                macWindowDragging = true;
                macWindowDragPressPosition = event->pos();
                return true;
            }
        }
#endif
        return false;
    }

    if (event->button() != Qt::LeftButton)
        return true;

    if (!layout->movable())
        return true;

    initDrag(event->position().toPoint());
    return true;
}